

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

NULLCArray NULLC::StrConcatenate(NULLCArray a,NULLCArray b)

{
  uint uVar1;
  uint size;
  uint uVar2;
  uint uVar3;
  NULLCArray NVar4;
  
  uVar1 = b.len;
  uVar2 = a.len;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (uint)(a.ptr[uVar2 - 1] == '\0');
  }
  size = (uVar1 + uVar2) - uVar3;
  NVar4.ptr = (char *)AllocObject(size,2);
  if (NVar4.ptr != (char *)0x0) {
    if (uVar2 != 0) {
      memcpy(NVar4.ptr,a.ptr,(ulong)uVar2);
    }
    if (uVar1 != 0) {
      memcpy(NVar4.ptr + ((ulong)uVar2 - (ulong)uVar3),b.ptr,(ulong)uVar1);
    }
  }
  NVar4.len = size;
  return NVar4;
}

Assistant:

NULLCArray NULLC::StrConcatenate(NULLCArray a, NULLCArray b)
{
	NULLCArray ret;

	// If first part is zero-terminated, override zero in the new string
	int shift = a.len && (a.ptr[a.len-1] == 0);
	ret.len = a.len + b.len - shift;
	ret.ptr = (char*)AllocObject(ret.len, NULLC_TYPE_CHAR);
	if(!ret.ptr)
		return ret;

	if(a.len)
		memcpy(ret.ptr, a.ptr, a.len);

	if(b.len)
		memcpy(ret.ptr + a.len - shift, b.ptr, b.len);

	return ret;
}